

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
handle_string(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
             ,item_event_visitor *visitor,basic_string_view<char,_std::char_traits<char>_> *v,
             error_code *ec)

{
  byte bVar1;
  string_view_type *in_RDI;
  semantic_tag tag;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  reference *in_stack_ffffffffffffffa0;
  reference *this_00;
  semantic_tag tag_00;
  undefined7 in_stack_ffffffffffffffb0;
  reference local_48;
  reference local_38;
  undefined1 local_21;
  
  local_21 = 0;
  std::bitset<3UL>::operator[]((bitset<3UL> *)in_RDI,(size_t)in_stack_ffffffffffffffa0);
  bVar1 = std::bitset::reference::operator_cast_to_bool(in_stack_ffffffffffffffa0);
  tag_00 = (semantic_tag)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  std::bitset<3UL>::reference::~reference(&local_38);
  if ((bVar1 & 1) != 0) {
    this_00 = (reference *)((_Base_bitset<1UL> *)&in_RDI[1]._M_len)->_M_w;
    switch(this_00) {
    case (reference *)0x0:
      local_21 = 4;
      break;
    default:
      break;
    case (reference *)0x20:
      local_21 = 0xe;
      break;
    case (reference *)0x21:
      local_21 = 0xc;
      break;
    case (reference *)0x22:
      local_21 = 9;
    }
    std::bitset<3UL>::operator[]((bitset<3UL> *)in_RDI,(size_t)this_00);
    std::bitset<3UL>::reference::operator=(this_00,(bool)in_stack_ffffffffffffff9f);
    tag_00 = (semantic_tag)((ulong)this_00 >> 0x38);
    std::bitset<3UL>::reference::~reference(&local_48);
  }
  basic_item_event_visitor<char>::string_value
            ((basic_item_event_visitor<char> *)CONCAT17(bVar1,in_stack_ffffffffffffffb0),in_RDI,
             tag_00,(ser_context *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             (error_code *)0x2e1751);
  *(byte *)&in_RDI->_M_str = (*(byte *)((long)&in_RDI->_M_str + 2) ^ 0xff) & 1;
  return;
}

Assistant:

void handle_string(item_event_visitor& visitor, const jsoncons::basic_string_view<char>& v, std::error_code& ec)
    {
        semantic_tag tag = semantic_tag::none;
        if (other_tags_[item_tag])
        {
            switch (raw_tag_)
            {
                case 0:
                    tag = semantic_tag::datetime;
                    break;
                case 32:
                    tag = semantic_tag::uri;
                    break;
                case 33:
                    tag = semantic_tag::base64url;
                    break;
                case 34:
                    tag = semantic_tag::base64;
                    break;
                default:
                    break;
            }
            other_tags_[item_tag] = false;
        }
        visitor.string_value(v, tag, *this, ec);
        more_ = !cursor_mode_;
    }